

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathBezierQuadraticCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,int num_segments)

{
  int iVar1;
  int iVar2;
  ImVec2 local_40;
  ImVec2 p1;
  
  p1 = (this->_Path).Data[(long)(this->_Path).Size + -1];
  if (num_segments != 0) {
    iVar1 = 0;
    if (0 < num_segments) {
      iVar1 = num_segments;
    }
    for (iVar2 = 1; iVar2 - iVar1 != 1; iVar2 = iVar2 + 1) {
      local_40 = ImBezierQuadraticCalc(&p1,p2,p3,(float)iVar2 * (1.0 / (float)num_segments));
      ImVector<ImVec2>::push_back(&this->_Path,&local_40);
    }
    return;
  }
  PathBezierQuadraticCurveToCasteljau
            (&this->_Path,p1.x,p1.y,p2->x,p2->y,p3->x,p3->y,this->_Data->CurveTessellationTol,0);
  return;
}

Assistant:

void ImDrawList::PathBezierQuadraticCurveTo(const ImVec2& p2, const ImVec2& p3, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierQuadraticCurveToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, _Data->CurveTessellationTol, 0);// Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierQuadraticCalc(p1, p2, p3, t_step * i_step));
    }
}